

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O3

int lzham::lzham_lib_z_deflateEnd(lzham_z_streamp pStream)

{
  lzham_uint32 lVar1;
  int iVar2;
  
  if (pStream == (lzham_z_streamp)0x0) {
    iVar2 = -2;
  }
  else {
    iVar2 = 0;
    if (pStream->state != (lzham_z_internal_state *)0x0) {
      lVar1 = lzham_lib_compress_deinit(pStream->state);
      pStream->adler = (ulong)lVar1;
      pStream->state = (lzham_z_internal_state *)0x0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int lzham_lib_z_deflateEnd(lzham_z_streamp pStream)
   {
      if (!pStream)
      {
         LZHAM_LOG_ERROR(6041);
         return LZHAM_Z_STREAM_ERROR;
      }

      lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
      if (pComp)
      {
         pStream->adler = lzham_lib_compress_deinit(pComp);

         pStream->state = NULL;
      }

      return LZHAM_Z_OK;
   }